

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O3

void __thiscall YAML::detail::node_data::compute_map_size(node_data *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var2 = (this->m_undefinedPairs).
           super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 = p_Var2, p_Var3 != (_List_node_base *)&this->m_undefinedPairs) {
    p_Var2 = p_Var3->_M_next;
    if ((**(char **)(p_Var3[1]._M_next)->_M_next == '\x01') &&
       (*(char *)(p_Var3[1]._M_prev)->_M_next->_M_next == '\x01')) {
      psVar1 = &(this->m_undefinedPairs).
                super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var3);
    }
  }
  return;
}

Assistant:

void node_data::compute_map_size() const {
  auto it = m_undefinedPairs.begin();
  while (it != m_undefinedPairs.end()) {
    auto jt = std::next(it);
    if (it->first->is_defined() && it->second->is_defined())
      m_undefinedPairs.erase(it);
    it = jt;
  }
}